

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<int>(cmXMLWriter *this,char *name,int *value)

{
  int iVar1;
  ostream *poVar2;
  int *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  PreAttribute(this);
  poVar2 = std::operator<<(this->Output,name);
  poVar2 = std::operator<<(poVar2,"=\"");
  iVar1 = SafeAttribute<int>(*value);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }